

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  double dVar1;
  Verbosity VVar2;
  ostream **ppoVar3;
  undefined8 uVar4;
  fpclass_type *pfVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  fpclass_type *pfVar9;
  long lVar10;
  Verbosity old_verbosity;
  Verbosity VVar11;
  char *pcVar12;
  ostream *poVar13;
  data_type *pdVar14;
  longdouble lVar15;
  Rational rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxviol_2;
  Rational sumviol;
  Rational maxviol;
  Rational boundviol;
  true_ local_219;
  data_type local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  void *pvStack_1f0;
  undefined8 local_1e8;
  undefined5 uStack_1e0;
  undefined3 uStack_1db;
  undefined5 uStack_1d8;
  fpclass_type local_1d0 [2];
  data_type local_1c8;
  undefined8 local_1b8;
  limb_pointer puStack_1b0;
  ulong local_1a8;
  limb_pointer puStack_1a0;
  undefined8 local_198;
  limb_pointer puStack_190;
  uint local_188;
  undefined1 local_184;
  fpclass_type local_180;
  fpclass_type fStack_17c;
  data_type local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  void *pvStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  undefined5 uStack_138;
  fpclass_type local_130 [2];
  data_type local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_108;
  void *pvStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  undefined5 uStack_e8;
  undefined8 local_e0;
  data_type local_d8;
  undefined8 local_c8;
  limb_pointer puStack_c0;
  ulong local_b8;
  limb_pointer puStack_b0;
  undefined8 local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  uint uStack_98;
  undefined1 uStack_94;
  undefined8 local_90;
  double local_88;
  double local_80;
  data_type local_78;
  undefined8 local_68;
  limb_pointer puStack_60;
  ulong local_58;
  limb_pointer puStack_50;
  undefined8 local_48;
  limb_pointer puStack_40;
  uint local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  iVar7 = soplex->_currentSettings->_intParamValues[0x12];
  if ((iVar7 == 2) || ((iVar7 == 1 && (soplex->_currentSettings->_intParamValues[0x10] == 1)))) {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar11 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar11) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal solution available.\n",0x1e);
        (soplex->spxout).m_verbosity = VVar11;
      }
    }
    else {
      local_d8.la[0] = 0;
      local_c8 = CONCAT17(local_c8._7_1_,0x10000000001);
      local_b8 = 1;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_218.la[0] = 0;
      local_208 = CONCAT17(local_208._7_1_,0x10000000001);
      local_1f8 = 1;
      local_1e8 = CONCAT17(local_1e8._7_1_,0x10000000001);
      local_178.la[0] = 0;
      local_168 = CONCAT17(local_168._7_1_,0x10000000001);
      local_158 = 1;
      local_148 = CONCAT17(local_148._7_1_,0x10000000001);
      bVar6 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolationRational(soplex,(Rational *)&local_d8.ld,(Rational *)&local_178.ld)
      ;
      if (bVar6) {
        bVar6 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolationRational
                          (soplex,(Rational *)&local_218.ld,(Rational *)&local_178.ld);
        if (!bVar6) goto LAB_00371e74;
        VVar11 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar11) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar7 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_d8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_218.ld);
          pdVar14 = &local_218;
          if (0 < iVar7) {
            pdVar14 = &local_d8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar14->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[0];
          if (NAN(dVar1)) {
            pcVar12 = "infeasible";
          }
          else {
            lVar15 = (longdouble)dVar1;
            local_1c8.ld.capacity = SUB104(lVar15,0);
            local_1c8.la[0]._4_4_ = (undefined4)((unkuint10)lVar15 >> 0x20);
            local_1c8.la[1]._0_2_ = (undefined2)((unkuint10)lVar15 >> 0x40);
            local_80 = dVar1;
            bVar6 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_128.ld,(longdouble *)&local_1c8,(true_ *)&local_78.ld);
            pcVar12 = "feasible";
            if (bVar6) {
              pcVar12 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                     0x10);
          poVar13 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar8 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_1c8.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_1c8.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_198._5_1_ == '\0') && (local_198._6_1_ == '\0')) {
            operator_delete(puStack_1a0,(local_1a8 & 0xffffffff) << 3);
          }
          if ((local_1b8._5_1_ == '\0') && (local_1b8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_1c8.la[1]._2_6_,local_1c8.la[1]._0_2_),
                            (ulong)local_1c8.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar11;
          if ((local_f8._5_1_ == '\0') && (local_f8._6_1_ == '\0')) {
            operator_delete(pvStack_100,(local_108 & 0xffffffff) << 3);
          }
          if ((local_118._5_1_ == '\0') && (local_118._6_1_ == '\0')) {
            operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_00371e74:
        VVar11 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar11) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check primal solution.\n",0x21);
          (soplex->spxout).m_verbosity = VVar11;
        }
      }
      if ((local_148._5_1_ == '\0') && (local_148._6_1_ == '\0')) {
        operator_delete(pvStack_150,(local_158 & 0xffffffff) << 3);
      }
      if ((local_168._5_1_ == '\0') && (local_168._6_1_ == '\0')) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      if ((local_1e8._5_1_ == '\0') && (local_1e8._6_1_ == '\0')) {
        operator_delete(pvStack_1f0,(local_1f8 & 0xffffffff) << 3);
      }
      if ((local_208._5_1_ == '\0') && (local_208._6_1_ == '\0')) {
        operator_delete(local_218.ld.data,(local_218.la[0] & 0xffffffff) << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(puStack_b0,(local_b8 & 0xffffffff) << 3);
      }
      if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
        operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
      }
    }
    if ((soplex->_hasSolReal != false) || ((soplex->_hasSolRational & 1U) != 0)) {
      local_d8.la[0] = 0;
      local_c8 = CONCAT17(local_c8._7_1_,0x10000000001);
      local_b8 = 1;
      local_a8 = CONCAT17(local_a8._7_1_,0x10000000001);
      local_218.la[0] = 0;
      local_208 = CONCAT17(local_208._7_1_,0x10000000001);
      local_1f8 = 1;
      local_1e8 = CONCAT17(local_1e8._7_1_,0x10000000001);
      local_178.la[0] = 0;
      local_168 = CONCAT17(local_168._7_1_,0x10000000001);
      local_158 = 1;
      local_148 = CONCAT17(local_148._7_1_,0x10000000001);
      bVar6 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getRedCostViolationRational
                        (soplex,(Rational *)&local_d8.ld,(Rational *)&local_178.ld);
      if (bVar6) {
        bVar6 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getDualViolationRational
                          (soplex,(Rational *)&local_218.ld,(Rational *)&local_178.ld);
        if (!bVar6) goto LAB_00372270;
        VVar11 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar11) {
          (soplex->spxout).m_verbosity = INFO1;
          iVar7 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_d8.ld,
                            (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_218.ld);
          pdVar14 = &local_218;
          if (0 < iVar7) {
            pdVar14 = &local_d8;
          }
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&pdVar14->ld);
          dVar1 = soplex->_currentSettings->_realParamValues[1];
          if (NAN(dVar1)) {
            pcVar12 = "infeasible";
          }
          else {
            lVar15 = (longdouble)dVar1;
            local_78.ld.capacity = SUB104(lVar15,0);
            local_78.la[0]._4_4_ = (undefined4)((unkuint10)lVar15 >> 0x20);
            local_78.la[1]._0_2_ = (undefined2)((unkuint10)lVar15 >> 0x40);
            local_88 = dVar1;
            bVar6 = boost::multiprecision::default_ops::
                    eval_gt_imp<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,long_double>
                              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_128.ld,(longdouble *)&local_78,&local_219);
            pcVar12 = "feasible";
            if (bVar6) {
              pcVar12 = "infeasible";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
          poVar13 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          sVar8 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     " in original problem (max. violation = ",0x27);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_78.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_128.ld);
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_78.ld);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],").\n",3);
          if ((local_48._5_1_ == '\0') && (local_48._6_1_ == '\0')) {
            operator_delete(puStack_50,(local_58 & 0xffffffff) << 3);
          }
          if ((local_68._5_1_ == '\0') && (local_68._6_1_ == '\0')) {
            operator_delete((void *)CONCAT62(local_78.la[1]._2_6_,local_78.la[1]._0_2_),
                            (ulong)local_78.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar11;
          if ((local_f8._5_1_ == '\0') && (local_f8._6_1_ == '\0')) {
            operator_delete(pvStack_100,(local_108 & 0xffffffff) << 3);
          }
          if ((local_118._5_1_ == '\0') && (local_118._6_1_ == '\0')) {
            operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
          }
        }
      }
      else {
LAB_00372270:
        VVar11 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar11) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"Could not check dual solution.\n",0x1f);
          (soplex->spxout).m_verbosity = VVar11;
        }
      }
      if ((local_148._5_1_ == '\0') && (local_148._6_1_ == '\0')) {
        operator_delete(pvStack_150,(local_158 & 0xffffffff) << 3);
      }
      if ((local_168._5_1_ == '\0') && (local_168._6_1_ == '\0')) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      if ((local_1e8._5_1_ == '\0') && (local_1e8._6_1_ == '\0')) {
        operator_delete(pvStack_1f0,(local_1f8 & 0xffffffff) << 3);
      }
      if ((local_208._5_1_ == '\0') && (local_208._6_1_ == '\0')) {
        operator_delete(local_218.ld.data,(local_218.la[0] & 0xffffffff) << 3);
      }
      if ((local_a8._5_1_ == '\0') && (local_a8._6_1_ == '\0')) {
        operator_delete(puStack_b0,(local_b8 & 0xffffffff) << 3);
      }
      if ((local_c8._5_1_ == '\0') && (local_c8._6_1_ == '\0')) {
        operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
      }
      goto LAB_0037238b;
    }
LAB_00371fa1:
    VVar11 = (soplex->spxout).m_verbosity;
    if ((int)VVar11 < 3) goto LAB_0037238b;
    (soplex->spxout).m_verbosity = INFO1;
    poVar13 = (soplex->spxout).m_streams[3];
    pcVar12 = "No dual solution available.\n";
    lVar10 = 0x1c;
  }
  else {
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) {
      VVar11 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar11) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar13 = (soplex->spxout).m_streams[3];
        pcVar12 = "No primal solution available.\n";
        lVar10 = 0x1e;
LAB_00371b2a:
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,lVar10);
        (soplex->spxout).m_verbosity = VVar11;
      }
    }
    else {
      local_1d0[0] = cpp_dec_float_finite;
      local_1d0[1] = 0x10;
      local_218.la[0] = 0;
      local_218.ld.data = (limb_pointer)0x0;
      local_208 = 0;
      uStack_200 = 0;
      local_1f8 = 0;
      pvStack_1f0 = (void *)0x0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      uStack_1db = 0;
      uStack_1d8 = 0;
      local_130[0] = cpp_dec_float_finite;
      local_130[1] = 0x10;
      local_178.la[0] = 0;
      local_178.ld.data = (limb_pointer)0x0;
      local_168 = 0;
      uStack_160 = 0;
      local_158 = 0;
      pvStack_150 = (void *)0x0;
      local_148 = 0;
      uStack_140 = 0;
      uStack_13b = 0;
      uStack_138 = 0;
      local_e0 = 0x1000000000;
      local_128.la[0] = 0;
      local_128.ld.data = (limb_pointer)0x0;
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0;
      pvStack_100 = (void *)0x0;
      local_f8 = 0;
      uStack_f0 = 0;
      uStack_eb = 0;
      uStack_e8 = 0;
      bVar6 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_218.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_128.ld);
      if (bVar6) {
        bVar6 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_178.ld,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_128.ld);
        if (bVar6) {
          VVar11 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar11) {
            (soplex->spxout).m_verbosity = INFO1;
            bVar6 = false;
            if ((local_1d0[0] != cpp_dec_float_NaN) &&
               (bVar6 = false, local_130[0] != cpp_dec_float_NaN)) {
              iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)&local_218.ld,
                                 (cpp_dec_float<100U,_int,_void> *)&local_178.ld);
              bVar6 = 0 < iVar7;
            }
            pdVar14 = &local_178;
            if (bVar6) {
              pdVar14 = &local_218;
            }
            uVar4 = *(undefined8 *)
                     (((cpp_dec_float<100U,_int,_void> *)&(pdVar14->ld).capacity)->data)._M_elems;
            local_198 = *(undefined8 *)&(&pdVar14->ld)[3].capacity;
            puStack_190 = (&pdVar14->ld)[3].data;
            local_1a8 = *(ulong *)&(&pdVar14->ld)[2].capacity;
            puStack_1a0 = (&pdVar14->ld)[2].data;
            local_1b8 = *(undefined8 *)&(&pdVar14->ld)[1].capacity;
            puStack_1b0 = (&pdVar14->ld)[1].data;
            local_1c8.ld.capacity = (uint)uVar4;
            local_1c8.la[0]._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
            local_1c8.la[1]._0_2_ = SUB82((pdVar14->ld).data,0);
            local_1c8.la[1]._2_6_ = (undefined6)((ulong)(pdVar14->ld).data >> 0x10);
            local_188 = (&pdVar14->ld)[4].capacity;
            local_184 = (&pdVar14->ld)[4].field_0x4;
            pfVar9 = local_130;
            if (bVar6) {
              pfVar9 = local_1d0;
            }
            local_180 = *pfVar9;
            pfVar5 = local_130;
            if (bVar6) {
              pfVar5 = local_1d0;
            }
            fStack_17c = pfVar5[1];
            pcVar12 = "infeasible";
            if ((*pfVar9 != cpp_dec_float_NaN) &&
               (dVar1 = soplex->_currentSettings->_realParamValues[0], !NAN(dVar1))) {
              local_90 = 0x1000000000;
              local_d8.la[0] = 0;
              local_d8.ld.data = (limb_pointer)0x0;
              local_c8 = 0;
              puStack_c0 = (limb_pointer)0x0;
              local_b8 = 0;
              puStack_b0 = (limb_pointer)0x0;
              local_a8 = 0;
              uStack_a0 = 0;
              uStack_9b = 0;
              uStack_98 = 0;
              uStack_94 = 0;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&local_d8.ld,dVar1);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)&local_1c8.ld,
                                 (cpp_dec_float<100U,_int,_void> *)&local_d8.ld);
              pcVar12 = "infeasible";
              if (iVar7 < 1) {
                pcVar12 = "feasible";
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Primal solution ",
                       0x10);
            poVar13 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            sVar8 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,sVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       " in original problem (max. violation = ",0x27);
            VVar2 = (soplex->spxout).m_verbosity;
            ppoVar3 = (soplex->spxout).m_streams;
            poVar13 = ppoVar3[VVar2];
            *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
                 *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb |
                 0x100;
            local_48 = local_198;
            puStack_40 = puStack_190;
            local_58 = local_1a8;
            puStack_50 = puStack_1a0;
            local_68 = local_1b8;
            puStack_60 = puStack_1b0;
            local_78.ld.capacity = local_1c8.ld.capacity;
            local_78.la[0]._4_4_ = local_1c8.la[0]._4_4_;
            local_78.la[1]._0_2_ = local_1c8.la[1]._0_2_;
            local_78.la[1]._2_6_ = local_1c8.la[1]._2_6_;
            local_38 = local_188;
            local_34 = local_184;
            local_30 = CONCAT44(fStack_17c,local_180);
            boost::multiprecision::operator<<
                      (ppoVar3[VVar2],
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_78.ld);
            poVar13 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            lVar10 = *(long *)poVar13;
            *(undefined8 *)(poVar13 + *(long *)(lVar10 + -0x18) + 8) = 8;
            lVar10 = *(long *)(lVar10 + -0x18);
            *(uint *)(poVar13 + lVar10 + 0x18) = *(uint *)(poVar13 + lVar10 + 0x18) & 0xfffffefb | 4
            ;
            pcVar12 = ").\n";
            lVar10 = 3;
            goto LAB_00371b2a;
          }
          goto LAB_00371b32;
        }
      }
      VVar11 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar11) {
        (soplex->spxout).m_verbosity = INFO1;
        poVar13 = (soplex->spxout).m_streams[3];
        pcVar12 = "Could not check primal solution.\n";
        lVar10 = 0x21;
        goto LAB_00371b2a;
      }
    }
LAB_00371b32:
    if ((soplex->_hasSolReal == false) && ((soplex->_hasSolRational & 1U) == 0)) goto LAB_00371fa1;
    local_1d0[0] = cpp_dec_float_finite;
    local_1d0[1] = 0x10;
    local_218.la[0] = 0;
    local_218.ld.data = (limb_pointer)0x0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    pvStack_1f0 = (void *)0x0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1db = 0;
    uStack_1d8 = 0;
    local_130[0] = cpp_dec_float_finite;
    local_130[1] = 0x10;
    local_178.la[0] = 0;
    local_178.ld.data = (limb_pointer)0x0;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    pvStack_150 = (void *)0x0;
    local_148 = 0;
    uStack_140 = 0;
    uStack_13b = 0;
    uStack_138 = 0;
    local_e0 = 0x1000000000;
    local_128.la[0] = 0;
    local_128.ld.data = (limb_pointer)0x0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    pvStack_100 = (void *)0x0;
    local_f8 = 0;
    uStack_f0 = 0;
    uStack_eb = 0;
    uStack_e8 = 0;
    bVar6 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getRedCostViolation
                      (soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_218.ld,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128.ld);
    if (bVar6) {
      bVar6 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_178.ld,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_128.ld);
      if (!bVar6) goto LAB_00371e48;
      VVar11 = (soplex->spxout).m_verbosity;
      if ((int)VVar11 < 3) goto LAB_0037238b;
      (soplex->spxout).m_verbosity = INFO1;
      bVar6 = false;
      if ((local_1d0[0] != cpp_dec_float_NaN) && (bVar6 = false, local_130[0] != cpp_dec_float_NaN))
      {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          ((cpp_dec_float<100U,_int,_void> *)&local_218.ld,
                           (cpp_dec_float<100U,_int,_void> *)&local_178.ld);
        bVar6 = 0 < iVar7;
      }
      pdVar14 = &local_178;
      if (bVar6) {
        pdVar14 = &local_218;
      }
      uVar4 = *(undefined8 *)
               (((cpp_dec_float<100U,_int,_void> *)&(pdVar14->ld).capacity)->data)._M_elems;
      local_198 = *(undefined8 *)&(&pdVar14->ld)[3].capacity;
      puStack_190 = (&pdVar14->ld)[3].data;
      local_1a8 = *(ulong *)&(&pdVar14->ld)[2].capacity;
      puStack_1a0 = (&pdVar14->ld)[2].data;
      local_1b8 = *(undefined8 *)&(&pdVar14->ld)[1].capacity;
      puStack_1b0 = (&pdVar14->ld)[1].data;
      local_1c8.ld.capacity = (uint)uVar4;
      local_1c8.la[0]._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      local_1c8.la[1]._0_2_ = SUB82((pdVar14->ld).data,0);
      local_1c8.la[1]._2_6_ = (undefined6)((ulong)(pdVar14->ld).data >> 0x10);
      local_188 = (&pdVar14->ld)[4].capacity;
      local_184 = (&pdVar14->ld)[4].field_0x4;
      pfVar9 = local_130;
      if (bVar6) {
        pfVar9 = local_1d0;
      }
      local_180 = *pfVar9;
      pfVar5 = local_130;
      if (bVar6) {
        pfVar5 = local_1d0;
      }
      fStack_17c = pfVar5[1];
      pcVar12 = "infeasible";
      if ((*pfVar9 != cpp_dec_float_NaN) &&
         (dVar1 = soplex->_currentSettings->_realParamValues[1], !NAN(dVar1))) {
        local_90 = 0x1000000000;
        local_d8.la[0] = 0;
        local_d8.ld.data = (limb_pointer)0x0;
        local_c8 = 0;
        puStack_c0 = (limb_pointer)0x0;
        local_b8 = 0;
        puStack_b0 = (limb_pointer)0x0;
        local_a8 = 0;
        uStack_a0 = 0;
        uStack_9b = 0;
        uStack_98 = 0;
        uStack_94 = 0;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_d8.ld,dVar1);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          ((cpp_dec_float<100U,_int,_void> *)&local_1c8.ld,
                           (cpp_dec_float<100U,_int,_void> *)&local_d8.ld);
        pcVar12 = "infeasible";
        if (iVar7 < 1) {
          pcVar12 = "feasible";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"Dual solution ",0xe);
      poVar13 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      sVar8 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                 " in original problem (max. violation = ",0x27);
      VVar2 = (soplex->spxout).m_verbosity;
      ppoVar3 = (soplex->spxout).m_streams;
      poVar13 = ppoVar3[VVar2];
      *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
           *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      local_d8.la[0] = CONCAT44(local_1c8.la[0]._4_4_,local_1c8.ld.capacity);
      local_d8.la[1] = CONCAT62(local_1c8.la[1]._2_6_,local_1c8.la[1]._0_2_);
      local_a8 = local_198;
      uStack_a0 = SUB85(puStack_190,0);
      uStack_9b = (undefined3)((ulong)puStack_190 >> 0x28);
      local_b8 = local_1a8;
      puStack_b0 = puStack_1a0;
      local_c8 = local_1b8;
      puStack_c0 = puStack_1b0;
      uStack_98 = local_188;
      uStack_94 = local_184;
      local_90 = CONCAT44(fStack_17c,local_180);
      boost::multiprecision::operator<<
                (ppoVar3[VVar2],
                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_d8.ld);
      poVar13 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      lVar10 = *(long *)poVar13;
      *(undefined8 *)(poVar13 + *(long *)(lVar10 + -0x18) + 8) = 8;
      lVar10 = *(long *)(lVar10 + -0x18);
      *(uint *)(poVar13 + lVar10 + 0x18) = *(uint *)(poVar13 + lVar10 + 0x18) & 0xfffffefb | 4;
      pcVar12 = ").\n";
      lVar10 = 3;
    }
    else {
LAB_00371e48:
      VVar11 = (soplex->spxout).m_verbosity;
      if ((int)VVar11 < 3) goto LAB_0037238b;
      (soplex->spxout).m_verbosity = INFO1;
      poVar13 = (soplex->spxout).m_streams[3];
      pcVar12 = "Could not check dual solution.\n";
      lVar10 = 0x1f;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar12,lVar10);
  (soplex->spxout).m_verbosity = VVar11;
LAB_0037238b:
  VVar11 = (soplex->spxout).m_verbosity;
  if (2 < (int)VVar11) {
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>((soplex->spxout).m_streams[3],"\n",1);
    (soplex->spxout).m_verbosity = VVar11;
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}